

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

MemTxResult
flatview_read(uc_struct_conflict15 *uc,FlatView *fv,hwaddr addr,MemTxAttrs attrs,void *buf,
             hwaddr len)

{
  MemTxResult MVar1;
  MemoryRegion_conflict *mr;
  hwaddr addr1;
  hwaddr l;
  
  l = len;
  mr = flatview_translate_tricore(uc,fv,addr,&addr1,&l,false,attrs);
  MVar1 = flatview_read_continue_tricore(uc,fv,addr,attrs,buf,len,addr1,l,mr);
  return MVar1;
}

Assistant:

static MemTxResult flatview_read(struct uc_struct *uc, FlatView *fv, hwaddr addr,
                                 MemTxAttrs attrs, void *buf, hwaddr len)
{
    hwaddr l;
    hwaddr addr1;
    MemoryRegion *mr;

    l = len;
    mr = flatview_translate(uc, fv, addr, &addr1, &l, false, attrs);
    return flatview_read_continue(uc, fv, addr, attrs, buf, len,
                                  addr1, l, mr);
}